

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofConstraint::getInfo1(btGeneric6DofConstraint *this,btConstraintInfo1 *info)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar5;
  btConstraintInfo1 bVar4;
  
  if (this->m_useSolveConstraintObsolete == true) {
    info->m_numConstraintRows = 0;
    info->nub = 0;
  }
  else {
    calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                              m_worldTransform,
                        &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                         m_worldTransform);
    info->m_numConstraintRows = 0;
    info->nub = 6;
    iVar3 = 0;
    iVar5 = 6;
    lVar2 = -3;
    do {
      if (((&this->m_angularLimits[0].m_loLimit)[lVar2] != 0.0) ||
         (*(char *)((long)(this->m_linearLimits).m_targetVelocity.m_floats + lVar2 + -1) != '\0')) {
        iVar3 = iVar3 + 1;
        iVar5 = iVar5 + -1;
        info->m_numConstraintRows = iVar3;
        info->nub = iVar5;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    iVar3 = 0;
    do {
      bVar1 = testAngularLimitMotor(this,iVar3);
      if (bVar1) {
        bVar4.m_numConstraintRows = (*info).m_numConstraintRows + 1;
        bVar4.nub = (*info).nub + -1;
        *info = bVar4;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo1 (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} else
	{
		//prepare constraint
		calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
		info->m_numConstraintRows = 0;
		info->nub = 6;
		int i;
		//test linear limits
		for(i = 0; i < 3; i++)
		{
			if(m_linearLimits.needApplyForce(i))
			{
				info->m_numConstraintRows++;
				info->nub--;
			}
		}
		//test angular limits
		for (i=0;i<3 ;i++ )
		{
			if(testAngularLimitMotor(i))
			{
				info->m_numConstraintRows++;
				info->nub--;
			}
		}
	}
}